

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_tests.cpp
# Opt level: O2

void validation_tests::TestBlockSubsidyHalvings(Params *consensusParams)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  CAmount *pCVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  check_type cVar5;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  assertion_result local_d0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  CAmount nSubsidy;
  char *local_90;
  char *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  char **local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  CAmount nPreviousSubsidy;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = &nPreviousSubsidy;
  nPreviousSubsidy = 10000000000;
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1e;
  file.m_begin = (iterator)&local_50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (char **)0xc694e1;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_88 = "";
  local_d0._0_8_ = 10000000000;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_80,&local_90,0x1e,1,2,pCVar3,"nPreviousSubsidy",&local_d0,"nInitialSubsidy * 2")
  ;
  for (iVar1 = 0; iVar1 != 0x40; iVar1 = iVar1 + 1) {
    nSubsidy = GetBlockSubsidy(consensusParams->nSubsidyHalvingInterval * iVar1,consensusParams);
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_a0 = "";
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar5 = 0x5f8090;
    msg_00.m_end = (iterator)pCVar3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = &DAT_00000022;
    file_00.m_begin = (iterator)&local_a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,
               msg_00);
    local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(nSubsidy < 0x12a05f201);
    local_d0.m_message.px = (element_type *)0x0;
    local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e0 = "nSubsidy <= nInitialSubsidy";
    local_d8 = "";
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = &local_e0;
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_e8 = "";
    pvVar4 = (iterator)0x0;
    pvVar2 = &DAT_00000001;
    boost::test_tools::tt_detail::report_assertion
              (&local_d0,&local_80,1,0,WARN,_cVar5,(size_t)&local_f0,0x22);
    boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar4;
    msg_01.m_begin = pvVar2;
    file_01.m_end = (iterator)0x23;
    file_01.m_begin = (iterator)&local_100;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_110,
               msg_01);
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_68 = (char **)0xc694e1;
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
    ;
    local_118 = "";
    local_d0._0_8_ = nPreviousSubsidy / 2;
    pvVar2 = (iterator)0x2;
    pCVar3 = &nSubsidy;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_80,&local_120,0x23,1,2,pCVar3,"nSubsidy",&local_d0,"nPreviousSubsidy / 2");
    nPreviousSubsidy = nSubsidy;
  }
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = (iterator)0x26;
  file_02.m_begin = (iterator)&local_130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_140,
             msg_02);
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (char **)0xc694e1;
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_tests.cpp"
  ;
  local_148 = "";
  local_d0._0_8_ = GetBlockSubsidy(consensusParams->nSubsidyHalvingInterval << 6,consensusParams);
  local_e0 = (char *)((ulong)local_e0 & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_80,&local_150,0x26,1,2,&local_d0,
             "GetBlockSubsidy(maxHalvings * consensusParams.nSubsidyHalvingInterval, consensusParams)"
             ,&local_e0,"0");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestBlockSubsidyHalvings(const Consensus::Params& consensusParams)
{
    int maxHalvings = 64;
    CAmount nInitialSubsidy = 50 * COIN;

    CAmount nPreviousSubsidy = nInitialSubsidy * 2; // for height == 0
    BOOST_CHECK_EQUAL(nPreviousSubsidy, nInitialSubsidy * 2);
    for (int nHalvings = 0; nHalvings < maxHalvings; nHalvings++) {
        int nHeight = nHalvings * consensusParams.nSubsidyHalvingInterval;
        CAmount nSubsidy = GetBlockSubsidy(nHeight, consensusParams);
        BOOST_CHECK(nSubsidy <= nInitialSubsidy);
        BOOST_CHECK_EQUAL(nSubsidy, nPreviousSubsidy / 2);
        nPreviousSubsidy = nSubsidy;
    }
    BOOST_CHECK_EQUAL(GetBlockSubsidy(maxHalvings * consensusParams.nSubsidyHalvingInterval, consensusParams), 0);
}